

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListAppendFromTerm
                    (Parse *pParse,SrcList *p,Token *pTable,Token *pDatabase,Token *pAlias,
                    Select *pSubquery,OnOrUsing *pOnUsing)

{
  undefined4 uVar1;
  int iVar2;
  SrcList *pSVar3;
  sqlite3 *in_RCX;
  sqlite3 *in_RDX;
  char *pcVar4;
  long in_RSI;
  Parse *in_RDI;
  SrcList *in_R8;
  Parse *in_R9;
  Token *pToken;
  sqlite3 *db;
  SrcItem *pItem;
  sqlite3 *in_stack_ffffffffffffffa8;
  sqlite3 *in_stack_ffffffffffffffb0;
  sqlite3 *pSelect;
  Parse *pParse_00;
  
  pSelect = in_RDI->db;
  if (((in_RSI == 0) && (pToken != (Token *)0x0)) &&
     ((pToken->z != (char *)0x0 || (*(long *)&pToken->n != 0)))) {
    pcVar4 = "USING";
    if (pToken->z != (char *)0x0) {
      pcVar4 = "ON";
    }
    sqlite3ErrorMsg(in_RDI,"a JOIN clause is required before %s",pcVar4);
  }
  else {
    pSVar3 = sqlite3SrcListAppend
                       ((Parse *)in_RCX,in_R8,(Token *)in_R9,(Token *)&DAT_aaaaaaaaaaaaaaaa);
    if (pSVar3 != (SrcList *)0x0) {
      pParse_00 = (Parse *)(pSVar3->a + (pSVar3->nSrc + -1));
      if ((1 < in_RDI->eParseMode) && (pParse_00->db != (sqlite3 *)0x0)) {
        if ((in_RCX != (sqlite3 *)0x0) && ((sqlite3 *)in_RCX->pVfs != (sqlite3 *)0x0)) {
          in_RDX = in_RCX;
        }
        in_stack_ffffffffffffffb0 = in_RDX;
        sqlite3RenameTokenMap(pParse_00,pSelect,(Token *)in_RDX);
        in_stack_ffffffffffffffa8 = in_RDX;
      }
      if (*(int *)&in_R8->a[0].zName != 0) {
        pcVar4 = sqlite3NameFromToken(in_stack_ffffffffffffffb0,(Token *)in_stack_ffffffffffffffa8);
        pParse_00->zErrMsg = pcVar4;
      }
      if (((in_R9 != (Parse *)0x0) &&
          (iVar2 = sqlite3SrcItemAttachSubquery
                             (in_R9,(SrcItem *)pParse_00,(Select *)pSelect,
                              (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20)), iVar2 != 0)) &&
         (((ulong)in_R9->db & 0x80000000000) != 0)) {
        *(ushort *)((long)&pParse_00->rc + 1) =
             *(ushort *)((long)&pParse_00->rc + 1) & 0xbfff | 0x4000;
      }
      if (pToken == (Token *)0x0) {
        pParse_00->nTab = 0;
        pParse_00->nMem = 0;
        return pSVar3;
      }
      if (*(long *)&pToken->n != 0) {
        *(ushort *)((long)&pParse_00->rc + 1) =
             *(ushort *)((long)&pParse_00->rc + 1) & 0xf7ff | 0x800;
        uVar1 = *(undefined4 *)&pToken->field_0xc;
        pParse_00->nTab = pToken->n;
        pParse_00->nMem = uVar1;
        return pSVar3;
      }
      *(char **)&pParse_00->nTab = pToken->z;
      return pSVar3;
    }
  }
  sqlite3ClearOnOrUsing(in_stack_ffffffffffffffb0,(OnOrUsing *)in_stack_ffffffffffffffa8);
  sqlite3SelectDelete(in_stack_ffffffffffffffb0,(Select *)in_stack_ffffffffffffffa8);
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppendFromTerm(
  Parse *pParse,          /* Parsing context */
  SrcList *p,             /* The left part of the FROM clause already seen */
  Token *pTable,          /* Name of the table to add to the FROM clause */
  Token *pDatabase,       /* Name of the database containing pTable */
  Token *pAlias,          /* The right-hand side of the AS subexpression */
  Select *pSubquery,      /* A subquery used in place of a table name */
  OnOrUsing *pOnUsing     /* Either the ON clause or the USING clause */
){
  SrcItem *pItem;
  sqlite3 *db = pParse->db;
  if( !p && pOnUsing!=0 && (pOnUsing->pOn || pOnUsing->pUsing) ){
    sqlite3ErrorMsg(pParse, "a JOIN clause is required before %s",
      (pOnUsing->pOn ? "ON" : "USING")
    );
    goto append_from_error;
  }
  p = sqlite3SrcListAppend(pParse, p, pTable, pDatabase);
  if( p==0 ){
    goto append_from_error;
  }
  assert( p->nSrc>0 );
  pItem = &p->a[p->nSrc-1];
  assert( (pTable==0)==(pDatabase==0) );
  assert( pItem->zName==0 || pDatabase!=0 );
  if( IN_RENAME_OBJECT && pItem->zName ){
    Token *pToken = (ALWAYS(pDatabase) && pDatabase->z) ? pDatabase : pTable;
    sqlite3RenameTokenMap(pParse, pItem->zName, pToken);
  }
  assert( pAlias!=0 );
  if( pAlias->n ){
    pItem->zAlias = sqlite3NameFromToken(db, pAlias);
  }
  assert( pSubquery==0 || pDatabase==0 );
  if( pSubquery ){
    if( sqlite3SrcItemAttachSubquery(pParse, pItem, pSubquery, 0) ){
      if( pSubquery->selFlags & SF_NestedFrom ){
        pItem->fg.isNestedFrom = 1;
      }
    }
  }
  assert( pOnUsing==0 || pOnUsing->pOn==0 || pOnUsing->pUsing==0 );
  assert( pItem->fg.isUsing==0 );
  if( pOnUsing==0 ){
    pItem->u3.pOn = 0;
  }else if( pOnUsing->pUsing ){
    pItem->fg.isUsing = 1;
    pItem->u3.pUsing = pOnUsing->pUsing;
  }else{
    pItem->u3.pOn = pOnUsing->pOn;
  }
  return p;

append_from_error:
  assert( p==0 );
  sqlite3ClearOnOrUsing(db, pOnUsing);
  sqlite3SelectDelete(db, pSubquery);
  return 0;
}